

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.hpp
# Opt level: O2

void __thiscall SoapySDR::Device::writeSetting<char_const*>(Device *this,string *key,char **value)

{
  string sStack_38;
  
  SettingToString<char_const*>(&sStack_38,(SoapySDR *)value,value);
  (*this->_vptr_Device[0x66])(this,key,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void SoapySDR::Device::writeSetting(const std::string &key, const Type &value)
{
    this->writeSetting(key, SoapySDR::SettingToString(value));
}